

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QModelIndexList * __thiscall QTreeView::selectedIndexes(QTreeView *this)

{
  bool bVar1;
  QItemSelectionModel *pQVar2;
  QModelIndex *this_00;
  qsizetype qVar3;
  const_reference pQVar4;
  long *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int i;
  QModelIndexList *viewSelected;
  QModelIndex index;
  QModelIndexList modelSelected;
  undefined7 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5f;
  QAbstractItemView *in_stack_ffffffffffffff60;
  int local_80;
  undefined1 *local_68;
  quintptr local_60;
  QAbstractItemModel *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  QAbstractItemModel *local_40;
  QList<QModelIndex> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8fdc17);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QModelIndex>::QList((QList<QModelIndex> *)0x8fdc51);
  pQVar2 = QAbstractItemView::selectionModel(in_stack_ffffffffffffff60);
  if (pQVar2 != (QItemSelectionModel *)0x0) {
    QAbstractItemView::selectionModel(in_stack_ffffffffffffff60);
    QItemSelectionModel::selectedIndexes();
    QList<QModelIndex>::operator=
              ((QList<QModelIndex> *)in_stack_ffffffffffffff60,
               (QList<QModelIndex> *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8fdc94);
  }
  local_80 = 0;
  while( true ) {
    this_00 = (QModelIndex *)(long)local_80;
    qVar3 = QList<QModelIndex>::size(&local_20);
    if (qVar3 <= (long)this_00) break;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = QList<QModelIndex>::at
                       ((QList<QModelIndex> *)this_00,
                        CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    local_50 = *(undefined1 **)pQVar4;
    local_48 = (undefined1 *)pQVar4->i;
    local_40 = (pQVar4->m).ptr;
    while( true ) {
      bVar1 = QModelIndex::isValid(this_00);
      in_stack_ffffffffffffff5f = 0;
      if (bVar1) {
        in_stack_ffffffffffffff5f = (**(code **)(*in_RSI + 0x2c0))(in_RSI,&local_50);
        in_stack_ffffffffffffff5f = in_stack_ffffffffffffff5f ^ 0xff;
      }
      if ((in_stack_ffffffffffffff5f & 1) == 0) break;
      QModelIndex::parent(in_RDI);
      local_50 = local_68;
      local_48 = (undefined1 *)local_60;
      local_40 = local_58;
    }
    bVar1 = QModelIndex::isValid(this_00);
    if (!bVar1) {
      QList<QModelIndex>::at
                ((QList<QModelIndex> *)this_00,
                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      QList<QModelIndex>::append
                ((QList<QModelIndex> *)this_00,
                 (parameter_type)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    }
    local_80 = local_80 + 1;
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8fddd2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QModelIndexList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndexList QTreeView::selectedIndexes() const
{
    QModelIndexList viewSelected;
    QModelIndexList modelSelected;
    if (selectionModel())
        modelSelected = selectionModel()->selectedIndexes();
    for (int i = 0; i < modelSelected.size(); ++i) {
        // check that neither the parents nor the index is hidden before we add
        QModelIndex index = modelSelected.at(i);
        while (index.isValid() && !isIndexHidden(index))
            index = index.parent();
        if (index.isValid())
            continue;
        viewSelected.append(modelSelected.at(i));
    }
    return viewSelected;
}